

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImVec2 in_RAX;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  bVar7 = window->WasActive;
  uVar10 = (uint)(GImGui->NavWindow == window);
  local_38 = in_RAX;
  if (bVar7 == false) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar5 = TreeNodeEx(label,uVar10,"%s \'%s\'%s",label,window->Name," *Inactive*");
    PopStyleColor(1);
    IsItemHovered(0);
  }
  else {
    bVar5 = TreeNodeEx(label,uVar10,"%s \'%s\'%s",label,window->Name,"");
    bVar6 = IsItemHovered(0);
    if ((bVar6 & bVar7) == 1) {
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0)
      ;
    }
  }
  if (bVar5 == false) {
    return;
  }
  if (window->MemoryCompacted == true) {
    TextDisabled("Note: some memory buffers have been compacted/freed.");
  }
  uVar10 = window->Flags;
  DebugNodeDrawList(window,window->DrawList,"DrawList");
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
             (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
             (double)(window->Size).y,(double)(window->ContentSize).x,
             (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
             (double)(window->ContentSizeIdeal).y);
  pcVar9 = "Child ";
  if ((uVar10 >> 0x18 & 1) == 0) {
    pcVar9 = "";
  }
  auVar22._0_4_ = -(uint)((uVar10 & 0x10000000) == 0);
  auVar22._4_4_ = -(uint)((uVar10 & 0x8000000) == 0);
  auVar22._8_4_ = -(uint)((uVar10 & 0x4000000) == 0);
  auVar22._12_4_ = -(uint)((uVar10 & 0x2000000) == 0);
  auVar21._0_4_ = -(uint)((uVar10 & 0x40) == 0);
  auVar21._4_4_ = -(uint)((uVar10 & 0x40000) == 0);
  auVar21._8_4_ = -(uint)((uVar10 & 0x200) == 0);
  auVar21._12_4_ = -(uint)((uVar10 & 0x100) == 0);
  auVar22 = packssdw(auVar21,auVar22);
  auVar22 = packsswb(auVar22,auVar22);
  pcVar8 = "Tooltip ";
  if ((auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar8 = "";
  }
  pcVar11 = "Popup ";
  if ((auVar22 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar11 = "";
  }
  pcVar13 = "Modal ";
  if ((auVar22 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((auVar22 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar19 = "NoMouseInputs";
  if ((auVar22 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar19 = "";
  }
  pcVar16 = "NoNavInputs";
  if ((auVar22 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  pcVar17 = "AlwaysAutoResize";
  if ((auVar22 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar10,pcVar9,pcVar8,pcVar11,pcVar13,
             pcVar14,pcVar15,pcVar19,pcVar16,pcVar17);
  pcVar9 = "##X";
  if (window->ScrollbarX == false) {
    pcVar9 = "\r\n";
  }
  pcVar8 = "##Y";
  if (window->ScrollbarY == false) {
    pcVar8 = "\r\n";
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y,
             pcVar9 + 2,pcVar8 + 2);
  if ((window->Active != false) || (uVar12 = 0xffffffff, window->WasActive != false)) {
    uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
             (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar9 = "NULL";
  }
  else {
    pcVar9 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar9);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar2 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar2) {
    fVar3 = window->NavRectRel[0].Min.y;
    fVar4 = window->NavRectRel[0].Max.y;
    if (fVar3 <= fVar4) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar3,(double)fVar2,
                 (double)fVar4);
      goto LAB_00188c1e;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_00188c1e:
  if (window->RootWindow != window) {
    DebugNodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    DebugNodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar7 = TreeNode("Columns","Columns sets (%d)"), bVar7)) {
    if (0 < (window->ColumnsStorage).Size) {
      lVar18 = 0;
      lVar20 = 0;
      do {
        DebugNodeColumns((ImGuiOldColumns *)((long)&((window->ColumnsStorage).Data)->ID + lVar18));
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x88;
      } while (lVar20 < (window->ColumnsStorage).Size);
    }
    TreePop();
  }
  DebugNodeStorage(&window->StateStorage,"Storage");
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}